

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.h
# Opt level: O0

cmCommand * __thiscall cmListCommand::Clone(cmListCommand *this)

{
  cmCommand *this_00;
  cmListCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmListCommand((cmListCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmListCommand;
    }